

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.cpp
# Opt level: O3

void __thiscall
HighsPseudocostInitialization::HighsPseudocostInitialization
          (HighsPseudocostInitialization *this,HighsPseudocost *pscost,HighsInt maxCount)

{
  double dVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  allocator_type local_62;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->pseudocostup,&pscost->pseudocostup);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->pseudocostdown,&pscost->pseudocostdown);
  local_38 = &this->pseudocostdown;
  std::vector<int,_std::allocator<int>_>::vector(&this->nsamplesup,&pscost->nsamplesup);
  local_50 = &this->nsamplesup;
  std::vector<int,_std::allocator<int>_>::vector(&this->nsamplesdown,&pscost->nsamplesdown);
  local_40 = &this->inferencesup;
  local_58 = &this->nsamplesdown;
  std::vector<double,_std::allocator<double>_>::vector(local_40,&pscost->inferencesup);
  local_48 = &this->inferencesdown;
  std::vector<double,_std::allocator<double>_>::vector(local_48,&pscost->inferencesdown);
  local_60 = &this->ninferencesup;
  std::vector<int,_std::allocator<int>_>::vector(local_60,&pscost->ninferencesup);
  std::vector<int,_std::allocator<int>_>::vector(&this->ninferencesdown,&pscost->ninferencesdown);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->conflictscoreup,
             (long)(pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_61);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->conflictscoredown,
             (long)(pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_62);
  dVar1 = pscost->inferences_total;
  this->cost_total = pscost->cost_total;
  this->inferences_total = dVar1;
  dVar1 = pscost->conflict_avg_score;
  lVar10 = pscost->nsamplestotal;
  if (0 < lVar10) {
    lVar10 = 1;
  }
  this->nsamplestotal = lVar10;
  lVar10 = 1;
  if (pscost->ninferencestotal < 1) {
    lVar10 = pscost->ninferencestotal;
  }
  this->ninferencestotal = lVar10;
  uVar12 = (ulong)((long)(this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar11 = (int)uVar12;
  this->conflict_avg_score = dVar1 / ((double)iVar11 * pscost->conflict_weight);
  if (iVar11 != 0) {
    piVar2 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->ninferencesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pscost->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar8 = (this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      iVar11 = *(int *)((long)piVar2 + lVar10);
      if (maxCount <= iVar11) {
        iVar11 = maxCount;
      }
      *(int *)((long)piVar2 + lVar10) = iVar11;
      iVar11 = *(int *)((long)piVar3 + lVar10);
      if (maxCount <= iVar11) {
        iVar11 = maxCount;
      }
      *(int *)((long)piVar3 + lVar10) = iVar11;
      iVar11 = *(int *)((long)piVar4 + lVar10);
      if (0 < iVar11) {
        iVar11 = 1;
      }
      *(int *)((long)piVar4 + lVar10) = iVar11;
      iVar11 = *(int *)((long)piVar5 + lVar10);
      if (0 < iVar11) {
        iVar11 = 1;
      }
      *(int *)((long)piVar5 + lVar10) = iVar11;
      *(double *)((long)pdVar8 + lVar10 * 2) =
           *(double *)((long)pdVar6 + lVar10 * 2) / pscost->conflict_weight;
      *(double *)((long)pdVar9 + lVar10 * 2) =
           *(double *)((long)pdVar7 + lVar10 * 2) / pscost->conflict_weight;
      lVar10 = lVar10 + 4;
    } while ((uVar12 & 0xffffffff) << 2 != lVar10);
  }
  return;
}

Assistant:

HighsPseudocostInitialization::HighsPseudocostInitialization(
    const HighsPseudocost& pscost, HighsInt maxCount)
    : pseudocostup(pscost.pseudocostup),
      pseudocostdown(pscost.pseudocostdown),
      nsamplesup(pscost.nsamplesup),
      nsamplesdown(pscost.nsamplesdown),
      inferencesup(pscost.inferencesup),
      inferencesdown(pscost.inferencesdown),
      ninferencesup(pscost.ninferencesup),
      ninferencesdown(pscost.ninferencesdown),
      conflictscoreup(pscost.conflictscoreup.size()),
      conflictscoredown(pscost.conflictscoreup.size()),
      cost_total(pscost.cost_total),
      inferences_total(pscost.inferences_total),
      conflict_avg_score(pscost.conflict_avg_score),
      nsamplestotal(std::min(int64_t{1}, pscost.nsamplestotal)),
      ninferencestotal(std::min(int64_t{1}, pscost.ninferencestotal)) {
  HighsInt ncol = pseudocostup.size();
  conflict_avg_score /= ncol * pscost.conflict_weight;
  for (HighsInt i = 0; i != ncol; ++i) {
    nsamplesup[i] = std::min(nsamplesup[i], maxCount);
    nsamplesdown[i] = std::min(nsamplesdown[i], maxCount);
    ninferencesup[i] = std::min(ninferencesup[i], HighsInt{1});
    ninferencesdown[i] = std::min(ninferencesdown[i], HighsInt{1});
    conflictscoreup[i] = pscost.conflictscoreup[i] / pscost.conflict_weight;
    conflictscoredown[i] = pscost.conflictscoredown[i] / pscost.conflict_weight;
  }
}